

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int on_frame_send(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  int iVar1;
  Curl_easy *local_148;
  char local_138 [4];
  int len;
  char buffer [256];
  Curl_easy *data;
  Curl_cfilter *cf;
  void *userp_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if (userp == (void *)0x0) {
    local_148 = (Curl_easy *)0x0;
  }
  else {
    local_148 = *(Curl_easy **)(*(long *)((long)userp + 0x10) + 0x10);
  }
  if ((((local_148 != (Curl_easy *)0x0) && (local_148 != (Curl_easy *)0x0)) &&
      ((*(ulong *)&(local_148->set).field_0x8ba >> 0x1c & 1) != 0)) &&
     ((userp != (void *)0x0 && (0 < *(int *)(*userp + 0xc))))) {
    iVar1 = fr_print(frame,local_138,0xff);
    local_138[iVar1] = '\0';
    if (((local_148 != (Curl_easy *)0x0) &&
        (((*(ulong *)&(local_148->set).field_0x8ba >> 0x1c & 1) != 0 && (userp != (void *)0x0)))) &&
       (0 < *(int *)(*userp + 0xc))) {
      Curl_trc_cf_infof(local_148,(Curl_cfilter *)userp,"[%d] -> %s",
                        (ulong)(uint)(frame->hd).stream_id,local_138);
    }
  }
  return 0;
}

Assistant:

static int on_frame_send(nghttp2_session *session, const nghttp2_frame *frame,
                         void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct Curl_easy *data = CF_DATA_CURRENT(cf);

  (void)session;
  DEBUGASSERT(data);
  if(data && Curl_trc_cf_is_verbose(cf, data)) {
    char buffer[256];
    int len;
    len = fr_print(frame, buffer, sizeof(buffer)-1);
    buffer[len] = 0;
    CURL_TRC_CF(data, cf, "[%d] -> %s", frame->hd.stream_id, buffer);
  }
  return 0;
}